

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>_>
::get_zero_pivot_cofacet
          (optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>_>
          *this,diameter_entry_t simplex,dimension_t dim)

{
  Simplex_coboundary_enumerator *this_00;
  optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
  cofacet;
  _Storage<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_true>
  local_30;
  char local_20;
  
  this_00 = &this->cofacets1;
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
  ::
  Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
  ::set_simplex(this_00,(diameter_entry_t)
                        simplex.
                        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
                ,dim);
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
  ::
  Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
  ::next_raw((optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
              *)&local_30._M_value,this_00,true);
  if (local_20 == '\x01') {
    do {
      if ((local_30._M_value.
           super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
           .first == simplex.
                     super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
                     .first) &&
         (!NAN(local_30._M_value.
               super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
               .first) &&
          !NAN(simplex.
               super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
               .first))) {
        *(ulong *)&(__return_storage_ptr__->
                   super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
                   )._M_payload.
                   super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
                   ._M_payload =
             CONCAT44(local_30._4_4_,
                      local_30._M_value.
                      super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
                      .first);
        ((entry_plain_t *)
        ((long)&(__return_storage_ptr__->
                super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
                )._M_payload.
                super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
                ._M_payload + 8))->index =
             (simplex_t)
             local_30._M_value.
             super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
             .second.index;
        (__return_storage_ptr__->
        super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
        )._M_payload.
        super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
        ._M_engaged = true;
        return __return_storage_ptr__;
      }
      Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
      ::
      Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
      ::next_raw((optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
                  *)&local_30._M_value,this_00,true);
    } while (local_20 != '\0');
  }
  (__return_storage_ptr__->
  super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
  )._M_payload.
  super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
  ._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> get_zero_pivot_cofacet(const diameter_entry_t simplex, const dimension_t dim) {
    cofacets1.set_simplex(simplex, dim);
    while(true) {
      std::optional<diameter_entry_t> cofacet = cofacets1.next_raw();
      if (!cofacet) break;
      if (get_diameter(*cofacet) == get_diameter(simplex)) return *cofacet;
    }
    return std::nullopt;
  }